

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenStructBody
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  pointer pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  Type *type;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  pointer ppFVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  key_type local_148;
  string local_128;
  KotlinKMPGenerator *local_108;
  char *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  string local_d8;
  string local_b8;
  CodeWriter *local_98;
  IdlNamer *local_90;
  long *local_88 [2];
  long local_78 [2];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_68;
  string local_50;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_108 = this;
  local_100 = nameprefix;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"align","");
  NumToString<unsigned_long>(&local_128,struct_def->minalign);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,&local_148);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"size","");
  NumToString<unsigned_long>(&local_128,struct_def->bytesize);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,&local_148);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"builder.prep({{align}}, {{size}})","");
  CodeWriter::operator+=(writer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_68,&(struct_def->fields).vec);
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_90 = &local_108->namer_;
    ppFVar10 = local_68.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_98 = writer;
    do {
      pFVar1 = ppFVar10[-1];
      if (pFVar1->padding != 0) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"pad","");
        NumToString<unsigned_long>(&local_128,pFVar1->padding);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_148);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"builder.pad({{pad}})","");
        CodeWriter::operator+=(writer,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if (((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) &&
         (struct_def_00 = (pFVar1->value).type.struct_def, struct_def_00->fixed == true)) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        pcVar2 = (pFVar1->super_Definition).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,pcVar2,
                   pcVar2 + (pFVar1->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_128);
        pcVar3 = local_100;
        strlen(local_100);
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_128,0,(char *)0x0,(ulong)pcVar3);
        writer = local_98;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_148.field_2._M_allocated_capacity = *psVar6;
          local_148.field_2._8_8_ = plVar5[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar6;
          local_148._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_148._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        GenStructBody(local_108,struct_def_00,local_98,local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        uVar8 = local_128.field_2._M_allocated_capacity;
        _Var9._M_p = local_128._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_001fb385:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"type","");
        GenMethod_abi_cxx11_(&local_128,(KotlinKMPGenerator *)&pFVar1->value,type);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_148);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"argname","");
        (*(local_90->super_Namer)._vptr_Namer[7])(local_88,local_90,pFVar1);
        pcVar3 = local_100;
        strlen(local_100);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,(ulong)pcVar3);
        local_f8 = &local_e8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_e8 = *plVar7;
          lStack_e0 = plVar5[3];
        }
        else {
          local_e8 = *plVar7;
          local_f8 = (long *)*plVar5;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_128.field_2._M_allocated_capacity = *psVar6;
          local_128.field_2._8_8_ = plVar5[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar6;
          local_128._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_128._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&writer->value_map_,&local_148);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"builder.put{{type}}({{argname}})","");
        CodeWriter::operator+=(writer,&local_b8);
        uVar8 = local_b8.field_2._M_allocated_capacity;
        _Var9._M_p = local_b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_001fb385;
      }
      ppFVar10 = ppFVar10 + -1;
    } while (ppFVar10 !=
             local_68.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        auto suffix = IsEnum(field.value.type) ? ".value" : "";
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname",
                        nameprefix + namer_.Variable(field) + suffix);
        writer += "builder.put{{type}}({{argname}})";
      }
    }
  }